

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<ProjectBuilderSources>::Inserter::insertOne
          (Inserter *this,qsizetype pos,ProjectBuilderSources *t)

{
  qsizetype in_RSI;
  Inserter *in_RDI;
  qsizetype i;
  ProjectBuilderSources *in_stack_ffffffffffffffe0;
  ProjectBuilderSources *this_00;
  
  setup(in_RDI,in_RSI,1);
  if (in_RDI->sourceCopyConstruct == 0) {
    ProjectBuilderSources::ProjectBuilderSources
              (in_stack_ffffffffffffffe0,(ProjectBuilderSources *)in_RDI);
    in_RDI->size = in_RDI->size + 1;
    for (this_00 = (ProjectBuilderSources *)0x0; this_00 != (ProjectBuilderSources *)in_RDI->move;
        this_00 = (ProjectBuilderSources *)((long)&this_00[-1].compiler.d.size + 7)) {
      ProjectBuilderSources::operator=(this_00,(ProjectBuilderSources *)in_RDI);
    }
    ProjectBuilderSources::operator=(this_00,(ProjectBuilderSources *)in_RDI);
  }
  else {
    ProjectBuilderSources::ProjectBuilderSources
              (in_stack_ffffffffffffffe0,(ProjectBuilderSources *)in_RDI);
    in_RDI->size = in_RDI->size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }